

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::BuildCamerasForNode
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,aiNode *pTarget)

{
  float fVar1;
  bool bVar2;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_00;
  basic_formatter *this_01;
  pointer ppVar3;
  Logger *pLVar4;
  aiCamera *this_02;
  double dVar5;
  double dVar6;
  aiVector3t<float> local_21c;
  aiCamera *local_210;
  aiCamera *out;
  Camera *srcCamera;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_78;
  _Self local_58;
  _Self local_50;
  const_iterator srcCameraIt;
  CameraInstance *cid;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
  *__range1;
  aiNode *pTarget_local;
  Node *pNode_local;
  ColladaParser *pParser_local;
  ColladaLoader *this_local;
  
  __end1 = std::
           vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
           ::begin(&pNode->mCameras);
  cid = (CameraInstance *)
        std::
        vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>::
        end(&pNode->mCameras);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Assimp::Collada::CameraInstance_*,_std::vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>_>
                                     *)&cid), bVar2) {
    srcCameraIt._M_node =
         (_Base_ptr)
         __gnu_cxx::
         __normal_iterator<const_Assimp::Collada::CameraInstance_*,_std::vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>_>
         ::operator*(&__end1);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>_>
         ::find(&pParser->mCameraLibrary,(key_type *)srcCameraIt._M_node);
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>_>
         ::end(&pParser->mCameraLibrary);
    bVar2 = std::operator==(&local_50,&local_58);
    if (bVar2) {
      pLVar4 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[40]>
                (&local_1f0,(char (*) [40])"Collada: Unable to find camera for ID \"");
      this_00 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_1f0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          srcCameraIt._M_node);
      this_01 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(this_00,(char (*) [13])"\". Skipping.");
      Formatter::basic_formatter::operator_cast_to_string(&local_78,this_01);
      Logger::warn(pLVar4,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1f0);
    }
    else {
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Camera>_>
               ::operator->(&local_50);
      out = (aiCamera *)&ppVar3->second;
      if (((ppVar3->second).mOrtho & 1U) != 0) {
        pLVar4 = DefaultLogger::get();
        Logger::warn(pLVar4,"Collada: Orthographic cameras are not supported.");
      }
      this_02 = (aiCamera *)operator_new(0x438);
      aiCamera::aiCamera(this_02);
      local_210 = this_02;
      aiString::operator=((aiString *)this_02,&pTarget->mName);
      aiVector3t<float>::aiVector3t(&local_21c,0.0,0.0,-1.0);
      (local_210->mLookAt).x = local_21c.x;
      (local_210->mLookAt).y = local_21c.y;
      (local_210->mLookAt).z = local_21c.z;
      local_210->mClipPlaneFar = *(float *)((out->mName).data + 0x30);
      local_210->mClipPlaneNear = *(float *)((out->mName).data + 0x2c);
      fVar1 = *(float *)((out->mName).data + 0x28);
      if ((fVar1 != 1e+11) || (NAN(fVar1))) {
        local_210->mAspect = *(float *)((out->mName).data + 0x28);
      }
      fVar1 = *(float *)((out->mName).data + 0x20);
      if ((fVar1 != 1e+11) || (NAN(fVar1))) {
        local_210->mHorizontalFOV = *(float *)((out->mName).data + 0x20);
        fVar1 = *(float *)((out->mName).data + 0x24);
        if (((fVar1 != 1e+11) || (NAN(fVar1))) &&
           ((fVar1 = *(float *)((out->mName).data + 0x28), fVar1 == 1e+11 && (!NAN(fVar1))))) {
          dVar6 = std::tan((double)(ulong)(uint)(*(float *)((out->mName).data + 0x20) * 0.017453292)
                          );
          dVar5 = std::tan((double)(ulong)(uint)(*(float *)((out->mName).data + 0x24) * 0.017453292)
                          );
          local_210->mAspect = SUB84(dVar6,0) / SUB84(dVar5,0);
        }
      }
      else {
        fVar1 = *(float *)((out->mName).data + 0x28);
        if (((fVar1 != 1e+11) || (NAN(fVar1))) &&
           ((fVar1 = *(float *)((out->mName).data + 0x24), fVar1 != 1e+11 || (NAN(fVar1))))) {
          fVar1 = *(float *)((out->mName).data + 0x28);
          dVar6 = std::tan((double)(ulong)(uint)(*(float *)((out->mName).data + 0x24) * 0.017453292
                                                * 0.5));
          dVar6 = std::atan((double)(ulong)(uint)(fVar1 * SUB84(dVar6,0)));
          local_210->mHorizontalFOV = SUB84(dVar6,0) * 57.29578 * 2.0;
        }
      }
      local_210->mHorizontalFOV = local_210->mHorizontalFOV * 0.017453292;
      std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::push_back(&this->mCameras,&local_210);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::Collada::CameraInstance_*,_std::vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ColladaLoader::BuildCamerasForNode(const ColladaParser& pParser, const Collada::Node* pNode, aiNode* pTarget) {
    for (const Collada::CameraInstance& cid : pNode->mCameras) {
        // find the referred light
        ColladaParser::CameraLibrary::const_iterator srcCameraIt = pParser.mCameraLibrary.find(cid.mCamera);
        if (srcCameraIt == pParser.mCameraLibrary.end()) {
            ASSIMP_LOG_WARN_F("Collada: Unable to find camera for ID \"", cid.mCamera, "\". Skipping.");
            continue;
        }
        const Collada::Camera* srcCamera = &srcCameraIt->second;

        // orthographic cameras not yet supported in Assimp
        if (srcCamera->mOrtho) {
            ASSIMP_LOG_WARN("Collada: Orthographic cameras are not supported.");
        }

        // now fill our ai data structure
        aiCamera* out = new aiCamera();
        out->mName = pTarget->mName;

        // collada cameras point in -Z by default, rest is specified in node transform
        out->mLookAt = aiVector3D(0.f, 0.f, -1.f);

        // near/far z is already ok
        out->mClipPlaneFar = srcCamera->mZFar;
        out->mClipPlaneNear = srcCamera->mZNear;

        // ... but for the rest some values are optional
        // and we need to compute the others in any combination.
        if (srcCamera->mAspect != 10e10f) {
            out->mAspect = srcCamera->mAspect;
        }

        if (srcCamera->mHorFov != 10e10f) {
            out->mHorizontalFOV = srcCamera->mHorFov;

            if (srcCamera->mVerFov != 10e10f && srcCamera->mAspect == 10e10f) {
                out->mAspect = std::tan(AI_DEG_TO_RAD(srcCamera->mHorFov)) /
                    std::tan(AI_DEG_TO_RAD(srcCamera->mVerFov));
            }

        } else if (srcCamera->mAspect != 10e10f && srcCamera->mVerFov != 10e10f)  {
            out->mHorizontalFOV = 2.0f * AI_RAD_TO_DEG(std::atan(srcCamera->mAspect *
                std::tan(AI_DEG_TO_RAD(srcCamera->mVerFov) * 0.5f)));
        }

        // Collada uses degrees, we use radians
        out->mHorizontalFOV = AI_DEG_TO_RAD(out->mHorizontalFOV);

        // add to camera list
        mCameras.push_back(out);
    }
}